

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

void VIRTUALCleanup(void)

{
  _CMI *p_Var1;
  PCMI pvMem;
  CPalThread *pThread;
  
  pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pThread == (CPalThread *)0x0) {
    pThread = CreateCurrentThreadData();
  }
  CorUnix::InternalEnterCriticalSection(pThread,&virtual_critsec);
  pvMem = pVirtualMemory;
  while (pvMem != (PCMI)0x0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012ffed;
    CorUnix::InternalFree(pvMem->pAllocState);
    CorUnix::InternalFree(pvMem->pProtectionState);
    p_Var1 = pvMem->pNext;
    CorUnix::InternalFree(pvMem);
    pvMem = p_Var1;
  }
  pVirtualMemory = (PCMI)0x0;
  pVirtualMemoryLastFound = (PCMI)0x0;
  CorUnix::InternalLeaveCriticalSection(pThread,&virtual_critsec);
  if (PAL_InitializeChakraCoreCalled != false) {
    DeleteCriticalSection(&virtual_critsec);
    return;
  }
LAB_0012ffed:
  abort();
}

Assistant:

void VIRTUALCleanup()
{
    PCMI pEntry;
    PCMI pTempEntry;
#if MMAP_IGNORES_HINT
    FREE_BLOCK *pFreeBlock;
    FREE_BLOCK *pTempFreeBlock;
#endif  // MMAP_IGNORES_HINT
    CPalThread * pthrCurrent = InternalGetCurrentThread();

    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    // Clean up the allocated memory.
    pEntry = pVirtualMemory;
    while ( pEntry )
    {
        WARN( "The memory at %d was not freed through a call to VirtualFree.\n",
              pEntry->startBoundary );
        InternalFree(pEntry->pAllocState);
        InternalFree(pEntry->pProtectionState );
#if MMAP_DOESNOT_ALLOW_REMAP
        InternalFree(pEntry->pDirtyPages );
#endif
        pTempEntry = pEntry;
        pEntry = pEntry->pNext;
        InternalFree(pTempEntry );
    }
    pVirtualMemory = NULL;
    pVirtualMemoryLastFound = NULL;

#if MMAP_IGNORES_HINT
    // Clean up the free list.
    pFreeBlock = pFreeMemory;
    while (pFreeBlock != NULL)
    {
        // Ignore errors from munmap. There's nothing we'd really want to
        // do about them.
        munmap(pFreeBlock->startBoundary, pFreeBlock->memSize);
        pTempFreeBlock = pFreeBlock;
        pFreeBlock = pFreeBlock->next;
        InternalFree(pTempFreeBlock);
    }
    pFreeMemory = NULL;
    gBackingBaseAddress = MAP_FAILED;
#endif  // MMAP_IGNORES_HINT

#if RESERVE_FROM_BACKING_FILE
    if (gBackingFile != -1)
    {
        close(gBackingFile);
        gBackingFile = -1;
    }
#endif  // RESERVE_FROM_BACKING_FILE

    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);

    TRACE( "Deleting the Virtual Critical Sections. \n" );
    DeleteCriticalSection( &virtual_critsec );
}